

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentId::CompareTypeAndIdFromPointer(ON_SubDComponentId *lhs,ON_SubDComponentId *rhs)

{
  byte bVar1;
  byte bVar2;
  uchar rhs_type;
  uchar lhs_type;
  ON_SubDComponentId *rhs_local;
  ON_SubDComponentId *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_SubDComponentId *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_SubDComponentId *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    bVar1 = lhs->m_type_and_dir & 6;
    bVar2 = rhs->m_type_and_dir & 6;
    if (bVar1 < bVar2) {
      lhs_local._4_4_ = -1;
    }
    else if (bVar2 < bVar1) {
      lhs_local._4_4_ = 1;
    }
    else if (lhs->m_id < rhs->m_id) {
      lhs_local._4_4_ = -1;
    }
    else if (rhs->m_id < lhs->m_id) {
      lhs_local._4_4_ = 1;
    }
    else {
      lhs_local._4_4_ = 0;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDComponentId::CompareTypeAndIdFromPointer(const ON_SubDComponentId* lhs, const ON_SubDComponentId* rhs)
{
  if (lhs == rhs)
    return 0;

  // nullptr sorts to end of list
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  // compare type
  const unsigned char lhs_type = (lhs->m_type_and_dir & ON_SubDComponentId::bits_type_mask);
  const unsigned char rhs_type = (rhs->m_type_and_dir & ON_SubDComponentId::bits_type_mask);
  if (lhs_type < rhs_type)
    return -1;
  if (lhs_type > rhs_type)
    return 1;

  // compare id
  if (lhs->m_id < rhs->m_id)
    return -1;
  if (lhs->m_id > rhs->m_id)
    return 1;

  return 0;
}